

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O0

void __thiscall
btHingeConstraint::btHingeConstraint
          (btHingeConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btTransform *rbAFrame,
          btTransform *rbBFrame,bool useReferenceFrameA)

{
  undefined8 *in_RDI;
  byte in_R9B;
  btRigidBody *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar1;
  undefined8 in_stack_ffffffffffffff88;
  btTypedConstraint *in_stack_ffffffffffffff90;
  undefined8 *puVar2;
  undefined8 *local_68;
  undefined8 *local_48;
  
  btTypedConstraint::btTypedConstraint
            (in_stack_ffffffffffffff90,
             (btTypedConstraintType)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             (btRigidBody *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  *in_RDI = &PTR__btHingeConstraint_002e72c0;
  local_48 = in_RDI + 9;
  do {
    btJacobianEntry::btJacobianEntry
              ((btJacobianEntry *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    local_48 = (undefined8 *)((long)local_48 + 0x54);
  } while (local_48 != (undefined8 *)((long)in_RDI + 0x144));
  local_68 = (undefined8 *)((long)in_RDI + 0x144);
  puVar2 = in_RDI + 0x48;
  do {
    btJacobianEntry::btJacobianEntry
              ((btJacobianEntry *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    local_68 = (undefined8 *)((long)local_68 + 0x54);
  } while (local_68 != puVar2);
  btTransform::btTransform
            ((btTransform *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (btTransform *)in_stack_ffffffffffffff78);
  btTransform::btTransform
            ((btTransform *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (btTransform *)in_stack_ffffffffffffff78);
  btAngularLimit::btAngularLimit((btAngularLimit *)(in_RDI + 0x59));
  *(undefined1 *)(in_RDI + 0x5f) = 0;
  *(undefined1 *)((long)in_RDI + 0x2f9) = 0;
  *(undefined1 *)((long)in_RDI + 0x2fa) = 0;
  *(undefined1 *)((long)in_RDI + 0x2fb) = 1;
  *(byte *)((long)in_RDI + 0x2fc) = in_R9B & 1;
  *(undefined4 *)((long)in_RDI + 0x304) = 0;
  *(undefined4 *)(in_RDI + 0x61) = 0;
  *(undefined4 *)((long)in_RDI + 0x30c) = 0;
  *(undefined4 *)(in_RDI + 0x62) = 0;
  *(undefined4 *)((long)in_RDI + 0x314) = 0;
  uVar1 = 0xbf800000;
  if ((*(byte *)((long)in_RDI + 0x2fc) & 1) == 0) {
    uVar1 = 0x3f800000;
  }
  *(undefined4 *)((long)in_RDI + 0x2f4) = uVar1;
  return;
}

Assistant:

btHingeConstraint::btHingeConstraint(btRigidBody& rbA,btRigidBody& rbB, 
								     const btTransform& rbAFrame, const btTransform& rbBFrame, bool useReferenceFrameA)
:btTypedConstraint(HINGE_CONSTRAINT_TYPE, rbA,rbB),m_rbAFrame(rbAFrame),m_rbBFrame(rbBFrame),
#ifdef _BT_USE_CENTER_LIMIT_
m_limit(),
#endif
m_angularOnly(false),
m_enableAngularMotor(false),
m_useSolveConstraintObsolete(HINGE_USE_OBSOLETE_SOLVER),
m_useOffsetForConstraintFrame(HINGE_USE_FRAME_OFFSET),
m_useReferenceFrameA(useReferenceFrameA),
m_flags(0),
m_normalCFM(0),
m_normalERP(0),
m_stopCFM(0),
m_stopERP(0)
{
#ifndef	_BT_USE_CENTER_LIMIT_
	//start with free
	m_lowerLimit = btScalar(1.0f);
	m_upperLimit = btScalar(-1.0f);
	m_biasFactor = 0.3f;
	m_relaxationFactor = 1.0f;
	m_limitSoftness = 0.9f;
	m_solveLimit = false;
#endif
	m_referenceSign = m_useReferenceFrameA ? btScalar(-1.f) : btScalar(1.f);
}